

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int LTnum(TValue *l,TValue *r)

{
  double dVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  lua_Number lVar9;
  double dVar10;
  long local_18;
  
  uVar2 = l->tt_;
  if (((uVar2 & 0xf) != 3) || (uVar3 = r->tt_, (uVar3 & 0xf) != 3)) {
    __assert_fail("(((((((l))->tt_)) & 0x0F)) == (3)) && (((((((r))->tt_)) & 0x0F)) == (3))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0x286,"int LTnum(const TValue *, const TValue *)");
  }
  if (uVar2 == 3) {
    dVar1 = (l->value_).n;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar1;
    if (uVar3 == 0x13) {
      lVar4 = (r->value_).i;
      if (0x40000000000000 < lVar4 + 0x20000000000000U) {
        auVar8 = vroundsd_avx(auVar8,auVar8,9);
        dVar10 = auVar8._0_8_;
        bVar7 = (long)dVar10 < lVar4;
        if (9.223372036854776e+18 <= dVar10) {
          bVar7 = dVar1 < 0.0;
        }
        if (dVar10 < -9.223372036854776e+18) {
          bVar7 = dVar1 < 0.0;
        }
        goto LAB_00122eae;
      }
      lVar9 = (lua_Number)lVar4;
    }
    else {
      if (uVar3 != 3) {
        __assert_fail("((((r))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x293,"int LTnum(const TValue *, const TValue *)");
      }
      lVar9 = (r->value_).n;
    }
    bVar7 = lVar9 == dVar1;
    bVar6 = lVar9 < dVar1;
  }
  else {
    if (uVar2 != 0x13) {
      __assert_fail("((((l))->tt_) == (((3) | ((0) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x28f,"int LTnum(const TValue *, const TValue *)");
    }
    lVar4 = (l->value_).i;
    if (uVar3 != 3) {
      if (uVar3 != 0x13) {
        __assert_fail("((((r))->tt_) == (((3) | ((0) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x28c,"int LTnum(const TValue *, const TValue *)");
      }
      bVar7 = lVar4 < (r->value_).i;
      goto LAB_00122eae;
    }
    dVar1 = (r->value_).n;
    if (0x40000000000000 < lVar4 + 0x20000000000000U) {
      iVar5 = luaV_flttointeger(dVar1,&local_18,F2Iceil);
      bVar7 = lVar4 < local_18;
      if (iVar5 == 0) {
        bVar7 = 0.0 < dVar1;
      }
      goto LAB_00122eae;
    }
    bVar7 = dVar1 == (double)lVar4;
    bVar6 = dVar1 < (double)lVar4;
  }
  bVar7 = !bVar6 && !bVar7;
LAB_00122eae:
  return (int)bVar7;
}

Assistant:

static int LTnum (const TValue *l, const TValue *r) {
  lua_assert(ttisnumber(l) && ttisnumber(r));
  if (ttisinteger(l)) {
    lua_Integer li = ivalue(l);
    if (ttisinteger(r))
      return li < ivalue(r);  /* both are integers */
    else  /* 'l' is int and 'r' is float */
      return LTintfloat(li, fltvalue(r));  /* l < r ? */
  }
  else {
    lua_Number lf = fltvalue(l);  /* 'l' must be float */
    if (ttisfloat(r))
      return luai_numlt(lf, fltvalue(r));  /* both are float */
    else  /* 'l' is float and 'r' is int */
      return LTfloatint(lf, ivalue(r));
  }
}